

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

int Sbd_StoObjBestCut(Sbd_Sto_t *p,int iObj,int nSize,int *pLeaves)

{
  int iVar1;
  int local_3c;
  Sbd_Cut_t *pSStack_38;
  int i;
  Sbd_Cut_t *pCutBest;
  int fVerbose;
  int *pLeaves_local;
  int nSize_local;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  pSStack_38 = (Sbd_Cut_t *)0x0;
  if (p->Pivot != iObj) {
    __assert_fail("p->Pivot == iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x326,"int Sbd_StoObjBestCut(Sbd_Sto_t *, int, int, int *)");
  }
  for (local_3c = 0; local_3c < p->nCutsR; local_3c = local_3c + 1) {
    if ((((nSize == 0) || (*(uint *)&p->ppCuts[local_3c]->field_0x14 >> 0x1c == nSize)) &&
        (p->nLutSize < (int)(*(uint *)&p->ppCuts[local_3c]->field_0x14 >> 0x1c))) &&
       ((((*(uint *)&p->ppCuts[local_3c]->field_0x14 >> 9 & 0x1ff) < 2 &&
         ((int)(*(uint *)&p->ppCuts[local_3c]->field_0x14 >> 0x12 & 0x3ff) <= p->nLutSize + -1)) &&
        ((pSStack_38 == (Sbd_Cut_t *)0x0 ||
         (iVar1 = Sbd_CutCompare2(pSStack_38,p->ppCuts[local_3c]), iVar1 == 1)))))) {
      pSStack_38 = p->ppCuts[local_3c];
    }
  }
  if (pSStack_38 == (Sbd_Cut_t *)0x0) {
    p_local._4_4_ = 0xffffffff;
  }
  else {
    if (10 < *(uint *)&pSStack_38->field_0x14 >> 0x1c) {
      __assert_fail("pCutBest->nLeaves <= SBD_DIV_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                    ,0x33c,"int Sbd_StoObjBestCut(Sbd_Sto_t *, int, int, int *)");
    }
    for (local_3c = 0; local_3c < (int)(*(uint *)&pSStack_38->field_0x14 >> 0x1c);
        local_3c = local_3c + 1) {
      pLeaves[local_3c] = pSStack_38->pLeaves[local_3c];
    }
    p_local._4_4_ = *(uint *)&pSStack_38->field_0x14 >> 0x1c;
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_StoObjBestCut( Sbd_Sto_t * p, int iObj, int nSize, int * pLeaves )
{
    int fVerbose = 0;
    Sbd_Cut_t * pCutBest = NULL;   int i;
    assert( p->Pivot == iObj );
    if ( fVerbose && iObj % 1000 == 0 )
        printf( "Node %6d : \n", iObj );
    for ( i = 0; i < p->nCutsR; i++ )
    {
        if ( fVerbose && iObj % 1000 == 0 )
            Sbd_CutPrint( p, iObj, p->ppCuts[i] );
        if ( nSize && (int)p->ppCuts[i]->nLeaves != nSize )
            continue;
        if ( (int)p->ppCuts[i]->nLeaves > p->nLutSize && 
             (int)p->ppCuts[i]->nSlowLeaves <= 1 &&
             (int)p->ppCuts[i]->nTopLeaves <= p->nLutSize-1 &&
             (pCutBest == NULL || Sbd_CutCompare2(pCutBest, p->ppCuts[i]) == 1) )
            pCutBest = p->ppCuts[i];
    }
    if ( fVerbose && iObj % 1000 == 0 )
    {
        printf( "Best cut of size %d:\n", nSize );
        Sbd_CutPrint( p, iObj, pCutBest );
    }
    if ( pCutBest == NULL )
        return -1;
    assert( pCutBest->nLeaves <= SBD_DIV_MAX );
    for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
        pLeaves[i] = pCutBest->pLeaves[i];
    return pCutBest->nLeaves;
}